

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_statistics.cpp
# Opt level: O2

void __thiscall
duckdb::ColumnStatistics::ColumnStatistics(ColumnStatistics *this,BaseStatistics *stats_p)

{
  _Head_base<0UL,_duckdb::DistinctStatistics_*,_false> __p;
  bool bVar1;
  _Head_base<0UL,_duckdb::DistinctStatistics_*,_false> local_20;
  
  BaseStatistics::BaseStatistics(&this->stats,stats_p);
  (this->distinct_stats).
  super_unique_ptr<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::DistinctStatistics_*,_std::default_delete<duckdb::DistinctStatistics>_>
  .super__Head_base<0UL,_duckdb::DistinctStatistics_*,_false>._M_head_impl =
       (DistinctStatistics *)0x0;
  bVar1 = DistinctStatistics::TypeIsSupported((LogicalType *)this);
  if (bVar1) {
    make_uniq<duckdb::DistinctStatistics>();
    __p._M_head_impl = local_20._M_head_impl;
    local_20._M_head_impl = (DistinctStatistics *)0x0;
    ::std::
    __uniq_ptr_impl<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>_>::
    reset((__uniq_ptr_impl<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>_>
           *)&this->distinct_stats,__p._M_head_impl);
    ::std::unique_ptr<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>_>
    ::~unique_ptr((unique_ptr<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>_>
                   *)&local_20);
  }
  return;
}

Assistant:

ColumnStatistics::ColumnStatistics(BaseStatistics stats_p) : stats(std::move(stats_p)) {
	if (DistinctStatistics::TypeIsSupported(stats.GetType())) {
		distinct_stats = make_uniq<DistinctStatistics>();
	}
}